

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_update_format(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  bcf_fmt_t *pbVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  size_t __n;
  uint8_t *__dest;
  byte *pbVar16;
  kstring_t str;
  kstring_t local_58;
  int32_t *local_40;
  char *local_38;
  
  local_40 = (int32_t *)values;
  local_38 = key;
  uVar8 = bcf_hdr_id2int(hdr,0,key);
  if (((int)uVar8 < 0) || ((~(hdr->id[0][uVar8].val)->info[2] & 0xf) == 0)) {
    return -(uint)(n != 0);
  }
  if ((line->unpacked & 8) == 0) {
    bcf_unpack(line,8);
  }
  uVar10 = *(ulong *)&line->field_0x10;
  uVar13 = (uint)(uVar10 >> 0x20) & 0xff;
  if ((uVar10 & 0xff00000000) == 0) {
    uVar15 = 0;
  }
  else {
    pbVar12 = (line->d).fmt;
    uVar15 = 0;
    do {
      if (pbVar12->id == uVar8) goto LAB_0011f976;
      uVar15 = uVar15 + 1;
      pbVar12 = pbVar12 + 1;
    } while ((uVar10 >> 0x20 & 0xff) != uVar15);
    uVar15 = (ulong)uVar13;
  }
LAB_0011f976:
  if ((uint)uVar15 == uVar13) {
    pbVar12 = (bcf_fmt_t *)0x0;
  }
  else {
    pbVar12 = (line->d).fmt + (uVar15 & 0xffffffff);
  }
  if (n == 0) {
    if (pbVar12 == (bcf_fmt_t *)0x0) {
      return 0;
    }
    if ((int)*(uint *)&pbVar12->field_0x1c < 0) {
      free(pbVar12->p + -(ulong)(*(uint *)&pbVar12->field_0x1c & 0x7fffffff));
      pbVar12->field_0x1f = pbVar12->field_0x1f & 0x7f;
    }
    (line->d).indiv_dirty = 1;
    pbVar12->p = (uint8_t *)0x0;
    return 0;
  }
  uVar13 = hdr->n[2] & 0xffffff;
  *(ulong *)&line->field_0x10 = uVar10 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
  iVar9 = n / (int)uVar13;
  if ((iVar9 == 0) || (uVar13 * iVar9 != n)) {
    __assert_fail("nps && nps*line->n_sample==n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                  ,0xae5,
                  "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                 );
  }
  local_58.l = 0;
  local_58.m = 0;
  local_58.s = (char *)0x0;
  bcf_enc_int1(&local_58,uVar8);
  if (type == 3) {
    bcf_enc_size(&local_58,iVar9,7);
    iVar9 = iVar9 * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28);
LAB_0011fac8:
    __n = (size_t)iVar9;
    uVar10 = local_58.l + __n + 1;
    pbVar11 = (byte *)local_58.s;
    if (local_58.m <= uVar10) {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      local_58.m = (uVar10 >> 0x10 | uVar10) + 1;
      pbVar11 = (byte *)realloc(local_58.s,local_58.m);
      if (pbVar11 == (byte *)0x0) goto LAB_0011fb53;
    }
    local_58.s = (char *)pbVar11;
    memcpy(local_58.s + local_58.l,local_40,__n);
    local_58.l = __n + local_58.l;
    local_58.s[local_58.l] = 0;
  }
  else {
    if (type == 2) {
      bcf_enc_size(&local_58,iVar9,5);
      iVar9 = iVar9 * (uint)((ulong)*(undefined8 *)&line->field_0x10 >> 0x28) * 4;
      goto LAB_0011fac8;
    }
    if (type != 1) {
      bcf_update_format_cold_1();
      goto LAB_0011ffa9;
    }
    bcf_enc_vint(&local_58,n,local_40,iVar9);
  }
LAB_0011fb53:
  if (pbVar12 == (bcf_fmt_t *)0x0) {
    bVar7 = (byte)((ulong)(*(long *)&line->field_0x10 + 0x100000000) >> 0x20);
    line->field_0x14 = bVar7;
    iVar9 = (line->d).m_fmt;
    if (iVar9 < (int)(uint)bVar7) {
      uVar8 = bVar7 - 1;
      uVar8 = (int)uVar8 >> 1 | uVar8;
      uVar8 = (int)uVar8 >> 2 | uVar8;
      uVar8 = (int)uVar8 >> 4 | uVar8;
      uVar8 = (int)uVar8 >> 8 | uVar8;
      uVar8 = (int)uVar8 >> 0x10 | uVar8;
      (line->d).m_fmt = uVar8 + 1;
      pbVar12 = (bcf_fmt_t *)realloc((line->d).fmt,(long)(int)uVar8 * 0x20 + 0x20);
      (line->d).fmt = pbVar12;
      memset(pbVar12 + iVar9,0,((long)(line->d).m_fmt - (long)iVar9) * 0x20);
    }
    uVar10 = *(ulong *)&line->field_0x10;
    if (((((uVar10 & 0xfe00000000) == 0) || (*local_38 != 'G')) || (local_38[1] != 'T')) ||
       (local_38[2] != '\0')) {
      pbVar12 = (bcf_fmt_t *)
                ((long)&(line->d).fmt[-1].id + (ulong)(((uint)(uVar10 >> 0x20) & 0xff) << 5));
    }
    else {
      uVar10 = uVar10 >> 0x20 & 0xff;
      lVar14 = uVar10 + 1;
      uVar10 = (ulong)(uint)((int)uVar10 << 5);
      do {
        pbVar12 = (line->d).fmt;
        puVar1 = (undefined8 *)((long)&pbVar12[-2].id + uVar10);
        uVar3 = *puVar1;
        uVar5 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pbVar12[-2].p + uVar10);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pbVar12[-1].p + uVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        puVar1 = (undefined8 *)((long)&pbVar12[-1].id + uVar10);
        *puVar1 = uVar3;
        puVar1[1] = uVar5;
        lVar14 = lVar14 + -1;
        uVar10 = uVar10 - 0x20;
      } while (2 < lVar14);
      pbVar12 = (line->d).fmt;
    }
    uVar3 = *(undefined8 *)&line->field_0x10;
    if ((*local_58.s & 0xfU) == 2) {
      pbVar11 = (byte *)(local_58.s + 3);
      iVar9 = (int)*(short *)(local_58.s + 1);
    }
    else if ((*local_58.s & 0xfU) == 1) {
      pbVar11 = (byte *)(local_58.s + 2);
      iVar9 = (int)local_58.s[1];
    }
    else {
      pbVar11 = (byte *)(local_58.s + 5);
      iVar9 = *(int *)(local_58.s + 1);
    }
    pbVar12->id = iVar9;
    bVar7 = *pbVar11;
    pbVar12->type = bVar7 & 0xf;
    if (*pbVar11 < 0xf0) {
      pbVar16 = pbVar11 + 1;
      uVar8 = (uint)(*pbVar11 >> 4);
    }
    else if ((pbVar11[1] & 0xf) == 2) {
      uVar8 = (uint)*(short *)(pbVar11 + 2);
      pbVar16 = pbVar11 + 4;
    }
    else if ((pbVar11[1] & 0xf) == 1) {
      uVar8 = (uint)(char)pbVar11[2];
      pbVar16 = pbVar11 + 3;
    }
    else {
      uVar8 = *(uint *)(pbVar11 + 2);
      pbVar16 = pbVar11 + 6;
    }
    pbVar12->n = uVar8;
    iVar9 = uVar8 << (bcf_type_shift[bVar7 & 0xf] & 0x1f);
    pbVar12->size = iVar9;
    pbVar12->p = pbVar16;
    *(uint *)&pbVar12->field_0x1c = (int)pbVar16 - (int)local_58.s & 0x7fffffff;
    pbVar12->p_len = iVar9 * (uint)((ulong)uVar3 >> 0x28);
    (line->d).indiv_dirty = 1;
    pbVar12->field_0x1f = pbVar12->field_0x1f | 0x80;
  }
  else {
    uVar10 = (ulong)((*(uint *)&pbVar12->field_0x1c & 0x7fffffff) + pbVar12->p_len);
    if (uVar10 < local_58.l) {
      if ((int)*(uint *)&pbVar12->field_0x1c < 0) {
LAB_0011ffa9:
        __assert_fail("!fmt->p_free",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0xb1f,
                      "int bcf_update_format(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                     );
      }
      uVar3 = *(undefined8 *)&line->field_0x10;
      if ((*local_58.s & 0xfU) == 2) {
        pbVar11 = (byte *)(local_58.s + 3);
        iVar9 = (int)*(short *)(local_58.s + 1);
      }
      else if ((*local_58.s & 0xfU) == 1) {
        pbVar11 = (byte *)(local_58.s + 2);
        iVar9 = (int)local_58.s[1];
      }
      else {
        pbVar11 = (byte *)(local_58.s + 5);
        iVar9 = *(int *)(local_58.s + 1);
      }
      pbVar12->id = iVar9;
      bVar7 = *pbVar11;
      pbVar12->type = bVar7 & 0xf;
      if (*pbVar11 < 0xf0) {
        pbVar16 = pbVar11 + 1;
        uVar8 = (uint)(*pbVar11 >> 4);
      }
      else if ((pbVar11[1] & 0xf) == 2) {
        uVar8 = (uint)*(short *)(pbVar11 + 2);
        pbVar16 = pbVar11 + 4;
      }
      else if ((pbVar11[1] & 0xf) == 1) {
        uVar8 = (uint)(char)pbVar11[2];
        pbVar16 = pbVar11 + 3;
      }
      else {
        uVar8 = *(uint *)(pbVar11 + 2);
        pbVar16 = pbVar11 + 6;
      }
      pbVar12->n = uVar8;
      iVar9 = uVar8 << (bcf_type_shift[bVar7 & 0xf] & 0x1f);
      pbVar12->size = iVar9;
      pbVar12->p = pbVar16;
      pbVar12->p_len = iVar9 * (uint)((ulong)uVar3 >> 0x28);
      *(uint *)&pbVar12->field_0x1c = (int)pbVar16 - (int)local_58.s | 0x80000000;
      (line->d).indiv_dirty = 1;
    }
    else {
      if (local_58.l != uVar10) {
        (line->d).indiv_dirty = 1;
      }
      puVar4 = pbVar12->p;
      uVar10 = (ulong)(*(uint *)&pbVar12->field_0x1c & 0x7fffffff);
      __dest = puVar4 + -uVar10;
      memcpy(__dest,local_58.s,local_58.l);
      free(local_58.s);
      uVar3 = *(undefined8 *)&line->field_0x10;
      bVar7 = puVar4[-uVar10] & 0xf;
      if (bVar7 == 2) {
        pbVar11 = __dest + 3;
        iVar9 = (int)*(short *)(__dest + 1);
      }
      else if (bVar7 == 1) {
        pbVar11 = __dest + 2;
        iVar9 = (int)(char)__dest[1];
      }
      else {
        pbVar11 = __dest + 5;
        iVar9 = *(int *)(__dest + 1);
      }
      pbVar12->id = iVar9;
      bVar7 = *pbVar11;
      pbVar12->type = bVar7 & 0xf;
      if (*pbVar11 < 0xf0) {
        pbVar16 = pbVar11 + 1;
        uVar8 = (uint)(*pbVar11 >> 4);
      }
      else if ((pbVar11[1] & 0xf) == 2) {
        uVar8 = (uint)*(short *)(pbVar11 + 2);
        pbVar16 = pbVar11 + 4;
      }
      else if ((pbVar11[1] & 0xf) == 1) {
        uVar8 = (uint)(char)pbVar11[2];
        pbVar16 = pbVar11 + 3;
      }
      else {
        uVar8 = *(uint *)(pbVar11 + 2);
        pbVar16 = pbVar11 + 6;
      }
      pbVar12->n = uVar8;
      iVar9 = uVar8 << (bcf_type_shift[bVar7 & 0xf] & 0x1f);
      pbVar12->size = iVar9;
      pbVar12->p = pbVar16;
      pbVar12->p_len = iVar9 * (uint)((ulong)uVar3 >> 0x28);
      *(uint *)&pbVar12->field_0x1c =
           (int)pbVar16 - (int)__dest & 0x7fffffffU | *(uint *)&pbVar12->field_0x1c & 0x80000000;
    }
  }
  *(byte *)&line->unpacked = (byte)line->unpacked | 8;
  return 0;
}

Assistant:

int bcf_update_format(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, fmt_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,fmt_id) )
    {
        if ( !n ) return 0;
        return -1;  // the key not present in the header
    }

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==fmt_id ) break;
    bcf_fmt_t *fmt = i==line->n_fmt ? NULL : &line->d.fmt[i];

    if ( !n )
    {
        if ( fmt )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( fmt->p_free )
            {
                free(fmt->p - fmt->p_off);
                fmt->p_free = 0;
            }
            line->d.indiv_dirty = 1;
            fmt->p = NULL;
        }
        return 0;
    }

    line->n_sample = bcf_hdr_nsamples(hdr);
    int nps = n / line->n_sample;  // number of values per sample
    assert( nps && nps*line->n_sample==n );     // must be divisible by n_sample

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, fmt_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, nps);
    else if ( type==BCF_HT_REAL )
    {
        bcf_enc_size(&str, nps, BCF_BT_FLOAT);
        kputsn((char*)values, nps*line->n_sample*sizeof(float), &str);
    }
    else if ( type==BCF_HT_STR )
    {
        bcf_enc_size(&str, nps, BCF_BT_CHAR);
        kputsn((char*)values, nps*line->n_sample, &str);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    if ( !fmt )
    {
        // Not present, new format field
        line->n_fmt++;
        hts_expand0(bcf_fmt_t, line->n_fmt, line->d.m_fmt, line->d.fmt);

        // Special case: VCF specification requires that GT is always first
        if ( line->n_fmt > 1 && key[0]=='G' && key[1]=='T' && !key[2] )
        {
            for (i=line->n_fmt-1; i>0; i--)
                line->d.fmt[i] = line->d.fmt[i-1];
            fmt = &line->d.fmt[0];
        }
        else
            fmt = &line->d.fmt[line->n_fmt-1];
        bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
        line->d.indiv_dirty = 1;
        fmt->p_free = 1;
    }
    else
    {
        // The tag is already present, check if it is big enough to accomodate the new block
        if ( str.l <= fmt->p_len + fmt->p_off )
        {
            // good, the block is big enough
            if ( str.l != fmt->p_len + fmt->p_off ) line->d.indiv_dirty = 1;
            uint8_t *ptr = fmt->p - fmt->p_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int p_free = fmt->p_free;
            bcf_unpack_fmt_core1(ptr, line->n_sample, fmt);
            fmt->p_free = p_free;
        }
        else
        {
            assert( !fmt->p_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_fmt_core1((uint8_t*)str.s, line->n_sample, fmt);
            fmt->p_free = 1;
            line->d.indiv_dirty = 1;
        }
    }
    line->unpacked |= BCF_UN_FMT;
    return 0;
}